

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.cxx
# Opt level: O1

bool cmSetDirectoryPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  string *prop;
  bool bVar4;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (((int)pbVar2 - (int)pbVar1 & 0x20U) != 0) {
      prop = pbVar1 + 1;
      bVar4 = prop == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (bVar4) {
          return bVar4;
        }
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 == 0) break;
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 == 0) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,
                     "Commands and macros cannot be set using SET_CMAKE_PROPERTIES","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003c4612;
        }
        cmMakefile::SetProperty(status->Makefile,prop,prop + 1);
        prop = prop + 2;
        bVar4 = prop == (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Variables and cache variables should be set using SET command",
                 "");
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003c4612:
      if (local_50[0] == local_40) {
        return bVar4;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return bVar4;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Wrong number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return false;
}

Assistant:

bool cmSetDirectoryPropertiesCommand(std::vector<std::string> const& args,
                                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // PROPERTIES followed by prop value pairs
  if (args.size() % 2 != 1) {
    status.SetError("Wrong number of arguments");
    return false;
  }

  for (auto iter = args.begin() + 1; iter != args.end(); iter += 2) {
    const std::string& prop = *iter;
    if (prop == "VARIABLES") {
      status.SetError(
        "Variables and cache variables should be set using SET command");
      return false;
    }
    if (prop == "MACROS") {
      status.SetError(
        "Commands and macros cannot be set using SET_CMAKE_PROPERTIES");
      return false;
    }
    status.GetMakefile().SetProperty(prop, *(iter + 1));
  }

  return true;
}